

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right_sequence.h
# Opt level: O1

void * __thiscall
bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::realloc
          (left_right_rep<Clasp::Literal,_unsigned_int> *this,void *__ptr,size_t __size)

{
  uint uVar1;
  buf_type *__src;
  uint uVar2;
  buf_type *__dest;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = *(uint *)&this->field_0x8 >> 2 & 0x1fffffff;
  uVar6 = 0x10;
  if (2 < uVar2) {
    uVar6 = (ulong)(uVar2 * 6 & 0xfffffffc);
  }
  __dest = (buf_type *)operator_new(uVar6);
  uVar2 = *(uint *)&this->field_0x8;
  uVar3 = uVar2 & 0x7fffffff;
  uVar1 = this->right_;
  uVar4 = uVar3 - uVar1;
  uVar5 = (uint)uVar6;
  if (uVar3 != uVar1 || this->left_ != 0) {
    __src = this->buf_;
    memcpy(__dest,__src,(ulong)(this->left_ & 0xfffffffc));
    memcpy(__dest + (uVar5 - uVar4),__src + uVar1,(ulong)(uVar4 & 0xfffffffc));
  }
  if ((int)uVar2 < 0) {
    operator_delete(this->buf_);
  }
  this->buf_ = __dest;
  *(uint *)&this->field_0x8 = uVar5 | 0x80000000;
  this->right_ = uVar5 - uVar4;
  return (void *)(ulong)(uVar5 | 0x80000000);
}

Assistant:

void left_right_rep<L, R>::realloc() {
	size_type new_cap = ((capacity()*3)>>1) * block_size;
	size_type min_cap = 4 * block_size;
	if (new_cap < min_cap) new_cap = min_cap;
	buf_type* temp = (buf_type*)::operator new(new_cap*sizeof(buf_type));
	size_type r = cap_ - right_;
	if (!empty()) {
		// copy left
		std::memcpy(temp, begin(), left_size()*sizeof(L));
		// copy right
		std::memcpy(temp+(new_cap-r), right(), right_size() * sizeof(R));
	}
	// swap
	release();
	buf_   = temp;
	cap_   = new_cap;
	free_  = 1;
	right_ = new_cap - r;
}